

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

string_type * __thiscall
booster::locale::impl_icu::date_format<wchar_t>::do_format_abi_cxx11_
          (string_type *__return_storage_ptr__,date_format<wchar_t> *this,double value,
          size_t *codepoints)

{
  int iVar1;
  UnicodeString tmp;
  code *local_58;
  undefined2 local_50;
  
  local_58 = std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname;
  local_50 = 2;
  icu_70::DateFormat::format(value * 1000.0,(UnicodeString *)this->icu_fmt_);
  iVar1 = icu_70::UnicodeString::countChar32((int)&local_58,0);
  *codepoints = (long)iVar1;
  icu_std_converter<wchar_t,4>::std_abi_cxx11_
            (__return_storage_ptr__,&this->cvt_,(UnicodeString *)&local_58);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string_type do_format(double value,size_t &codepoints) const 
            {
                UDate date = value * 1000.0; /// UDate is time_t in miliseconds
                icu::UnicodeString tmp;
                icu_fmt_->format(date,tmp);
                codepoints=tmp.countChar32();
                return cvt_.std(tmp);
            }